

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Testlist * __thiscall Parser::arrayInit(Parser *this)

{
  Testlist *pTVar1;
  undefined8 extraout_RAX;
  Token closeBrace;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string local_c8;
  string local_a8;
  Token local_88;
  
  pTVar1 = testList(this);
  Tokenizer::getToken(&local_88,this->tokenizer);
  if (local_88._symbol == ']') {
    Token::~Token(&local_88);
    return pTVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"Parser::arrayInit",&local_c9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Expected an ] sign, instead got",&local_ca);
  die(this,&local_a8,&local_c8,&local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  Token::~Token(&local_88);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Testlist *Parser::arrayInit() {
//    Token openBrace = tokenizer.getToken();
//    if (!openBrace.isOpenBrace())
//        die("Parser::arrayInit", "Expected an [ sign, instead got", openBrace);
    Testlist * arrayTestlist = testList();
    Token closeBrace = tokenizer.getToken();
    if (!closeBrace.isCloseBrace())
        die("Parser::arrayInit", "Expected an ] sign, instead got", closeBrace);
    return arrayTestlist;
}